

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorStraightGradientInstancer::InstanceDecorator
          (DecoratorStraightGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  bool bVar1;
  Colour<unsigned_char,_255,_false> in_start;
  Property *pPVar2;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<Decorator> SVar3;
  undefined1 local_50 [8];
  SharedPtr<Rml::DecoratorStraightGradient> decorator;
  Colourb stop;
  Colourb start;
  Direction direction;
  DecoratorInstancerInterface *param_4_local;
  PropertyDictionary *properties__local;
  String *name_local;
  DecoratorStraightGradientInstancer *this_local;
  
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            properties_,"horizontal-gradient");
  if (bVar1) {
    stop.red = '\0';
    stop.green = '\0';
    stop.blue = '\0';
    stop.alpha = '\0';
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              properties_,"vertical-gradient");
    if (bVar1) {
      stop.red = '\x01';
      stop.green = '\0';
      stop.blue = '\0';
      stop.alpha = '\0';
    }
    else {
      pPVar2 = PropertyDictionary::GetProperty
                         ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
      stop = (Colourb)Property::Get<int>(pPVar2);
      Log::Message(LT_WARNING,
                   "Decorator syntax \'gradient(horizontal|vertical ...)\' is deprecated, please replace with \'horizontal-gradient(...)\' or \'vertical-gradient(...)\'"
                  );
    }
  }
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  in_start = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar2);
  MakeShared<Rml::DecoratorStraightGradient>();
  this_00 = ::std::
            __shared_ptr_access<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
  bVar1 = DecoratorStraightGradient::Initialise
                    (this_00,(Direction)stop,in_start,
                     decorator.
                     super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_);
  if (bVar1) {
    ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorStraightGradient,void>
              ((shared_ptr<Rml::Decorator> *)this,
               (shared_ptr<Rml::DecoratorStraightGradient> *)local_50);
  }
  else {
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0)
    ;
  }
  ::std::shared_ptr<Rml::DecoratorStraightGradient>::~shared_ptr
            ((shared_ptr<Rml::DecoratorStraightGradient> *)local_50);
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorStraightGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	using Direction = DecoratorStraightGradient::Direction;
	Direction direction;
	if (name == "horizontal-gradient")
		direction = Direction::Horizontal;
	else if (name == "vertical-gradient")
		direction = Direction::Vertical;
	else
	{
		direction = (Direction)properties_.GetProperty(ids.direction)->Get<int>();
		Log::Message(Log::LT_WARNING,
			"Decorator syntax 'gradient(horizontal|vertical ...)' is deprecated, please replace with 'horizontal-gradient(...)' or "
			"'vertical-gradient(...)'");
	}

	Colourb start = properties_.GetProperty(ids.start)->Get<Colourb>();
	Colourb stop = properties_.GetProperty(ids.stop)->Get<Colourb>();

	auto decorator = MakeShared<DecoratorStraightGradient>();
	if (decorator->Initialise(direction, start, stop))
		return decorator;

	return nullptr;
}